

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

id_type entt::type_hash<Components::Velocity,_void>::value(void)

{
  id_type iVar1;
  
  iVar1 = internal::type_hash<Components::Velocity,_18446744073709551615UL>(0);
  return iVar1;
}

Assistant:

[[nodiscard]] static constexpr id_type value() ENTT_NOEXCEPT {
        return internal::type_hash<Type>(0);
#else
    [[nodiscard]] static constexpr id_type value() ENTT_NOEXCEPT {
        return type_index<Type>::value();
#endif
    }

    /*! @copydoc value */
    [[nodiscard]] constexpr operator id_type() const ENTT_NOEXCEPT {
        return value();
    }
}